

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type * __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>_>
::dx(value_type *__return_storage_ptr__,
    FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>_>_>
    *this,int i)

{
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_138;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_128;
  value_type local_118;
  value_type local_f8;
  value_type local_d8;
  value_type local_b8;
  value_type local_98;
  value_type local_78;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_58;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_48;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_38;
  
  FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::dx
            (&local_78,&this->left_->fadexpr_,i);
  FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>::val(&local_98,&this->right_->fadexpr_);
  local_138.fadexpr_.left_ = &local_78;
  local_138.fadexpr_.right_ = &local_98;
  FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>::dx(&local_b8,&this->right_->fadexpr_,i);
  FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<Fad<Fad<double>_>,_Fad<Fad<double>_>_>_>_>::val
            (&local_d8,&this->left_->fadexpr_);
  local_128.fadexpr_.right_ = &local_48;
  local_128.fadexpr_.left_ = &local_138;
  local_48.fadexpr_.left_ = &local_b8;
  local_48.fadexpr_.right_ = &local_d8;
  FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>::val(&local_f8,&this->right_->fadexpr_);
  FadBinaryAdd<Fad<Fad<double>_>,_FadCst<double>_>::val(&local_118,&this->right_->fadexpr_);
  local_38.fadexpr_.right_ = &local_58;
  local_38.fadexpr_.left_ = &local_128;
  local_58.fadexpr_.left_ = &local_f8;
  local_58.fadexpr_.right_ = &local_118;
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (__return_storage_ptr__,&local_38);
  Fad<double>::~Fad(&local_118);
  Fad<double>::~Fad(&local_f8);
  Fad<double>::~Fad(&local_d8);
  Fad<double>::~Fad(&local_b8);
  Fad<double>::~Fad(&local_98);
  Fad<double>::~Fad(&local_78);
  return __return_storage_ptr__;
}

Assistant:

const value_type dx(int i) const {return  (left_.dx(i) * right_.val() - right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}